

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ConvertComplexPass.h
# Opt level: O3

StructDeclaration * __thiscall
soul::ConvertComplexPass::ConvertComplexRemapTypes::visit
          (ConvertComplexRemapTypes *this,StructDeclaration *s)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  Member *m;
  Member *e;
  
  sVar1 = (s->members).numActive;
  if (sVar1 != 0) {
    sVar2 = (this->super_RewritingASTVisitor).itemsReplaced;
    e = (s->members).items;
    lVar3 = sVar1 * 0x28;
    do {
      RewritingASTVisitor::replaceExpression(&this->super_RewritingASTVisitor,&e->type);
      e = e + 1;
      lVar3 = lVar3 + -0x28;
    } while (lVar3 != 0);
    if (sVar2 != (this->super_RewritingASTVisitor).itemsReplaced) {
      AST::StructDeclaration::updateStructureMembers(s);
    }
  }
  return s;
}

Assistant:

AST::StructDeclaration& visit (AST::StructDeclaration& s) override
        {
            auto r = itemsReplaced;
            super::visit (s);

            if (r != itemsReplaced)
                s.updateStructureMembers();

            return s;
        }